

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O3

bool_t objIsOperable(void *obj)

{
  bool_t bVar1;
  bool_t bVar2;
  ulong uVar3;
  
  bVar1 = objIsOperable2(obj);
  if (bVar1 == 0) {
LAB_00136a8f:
    bVar1 = 0;
  }
  else {
    bVar1 = 1;
    if (*(long *)((long)obj + 0x10) != 0) {
      uVar3 = 0;
      do {
        bVar2 = objIsOperable(*(void **)((long)obj + uVar3 * 8 + 0x18));
        if (bVar2 == 0) goto LAB_00136a8f;
        uVar3 = uVar3 + 1;
      } while (uVar3 < *(ulong *)((long)obj + 0x10));
    }
  }
  return bVar1;
}

Assistant:

bool_t objIsOperable(const void* obj)
{
	size_t i;
	// проверить сам объект
	if (!objIsOperable2(obj))
		return FALSE;
	// проверить ссылочные объекты
	for (i = 0; i < objOCount(obj); ++i)
		if (!objIsOperable(objCPtr(obj, i, void)))
			return FALSE;
	// все нормально
	return TRUE;
}